

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

int run_test_fs_readdir_non_empty_dir(void)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  undefined1 auStack_8d8 [440];
  uv_fs_t *puStack_720;
  undefined1 local_710 [440];
  uv_fs_t local_558;
  undefined1 local_3a0 [440];
  undefined1 local_1e8 [440];
  
  puStack_720 = (uv_fs_t *)0x15a9d5;
  cleanup_test_files();
  puStack_720 = (uv_fs_t *)0x15a9da;
  uVar2 = uv_default_loop();
  puStack_720 = (uv_fs_t *)0x15a9f9;
  iVar1 = uv_fs_mkdir(uVar2,local_3a0,"test_dir",0x1ed,0);
  if (iVar1 == 0) {
    puStack_720 = (uv_fs_t *)0x15aa06;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15aa2b;
    iVar1 = uv_fs_open(uVar2,&local_558,"test_dir/file1",0x41,0x180,0);
    puVar3 = unaff_RBX;
    if (iVar1 < 0) goto LAB_0015add1;
    puVar3 = &local_558;
    puStack_720 = (uv_fs_t *)0x15aa43;
    uv_fs_req_cleanup(puVar3);
    puStack_720 = (uv_fs_t *)0x15aa48;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15aa5a;
    iVar1 = uv_fs_close(uVar2,local_710,(undefined4)local_558.result,0);
    if (iVar1 != 0) goto LAB_0015add6;
    puStack_720 = (uv_fs_t *)0x15aa6c;
    uv_fs_req_cleanup(local_710);
    puStack_720 = (uv_fs_t *)0x15aa71;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15aa96;
    iVar1 = uv_fs_open(uVar2,&local_558,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015addb;
    puVar3 = &local_558;
    puStack_720 = (uv_fs_t *)0x15aaae;
    uv_fs_req_cleanup(puVar3);
    puStack_720 = (uv_fs_t *)0x15aab3;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15aac5;
    iVar1 = uv_fs_close(uVar2,local_710,(undefined4)local_558.result,0);
    if (iVar1 != 0) goto LAB_0015ade0;
    puStack_720 = (uv_fs_t *)0x15aad7;
    uv_fs_req_cleanup(local_710);
    puStack_720 = (uv_fs_t *)0x15aadc;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15aafb;
    iVar1 = uv_fs_mkdir(uVar2,local_3a0,"test_dir/test_subdir",0x1ed,0);
    if (iVar1 != 0) goto LAB_0015ade5;
    puStack_720 = (uv_fs_t *)0x15ab10;
    uv_fs_req_cleanup(local_3a0);
    puVar3 = &opendir_req;
    puStack_720 = (uv_fs_t *)0x15ab29;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_720 = (uv_fs_t *)0x15ab2e;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15ab42;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015adea;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015adef;
    if (opendir_req.result != 0) goto LAB_0015adf4;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015adf9;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_720 = (uv_fs_t *)0x15ab93;
    uv_fs_req_cleanup(&opendir_req);
    puStack_720 = (uv_fs_t *)0x15ab98;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15abac;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
    if (iVar1 == 0) {
LAB_0015adc7:
      puStack_720 = (uv_fs_t *)0x15adcc;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015adcc;
    }
    lVar4 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_720 = (uv_fs_t *)0x15abe1;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_720 = (uv_fs_t *)0x15abf4;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_0015ac0b;
        puStack_720 = (uv_fs_t *)0x15ac03;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_0015ac0b;
LAB_0015adbd:
        puStack_720 = (uv_fs_t *)0x15adc2;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015adc2:
        puStack_720 = (uv_fs_t *)0x15adc7;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015adc7;
      }
LAB_0015ac0b:
      puStack_720 = (uv_fs_t *)0x15ac16;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ac33;
        goto LAB_0015adc2;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_720 = (uv_fs_t *)0x15adbd;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015adbd;
      }
LAB_0015ac33:
      puStack_720 = (uv_fs_t *)0x15ac3b;
      uv_fs_req_cleanup(&readdir_req);
      puStack_720 = (uv_fs_t *)0x15ac40;
      uVar2 = uv_default_loop();
      puStack_720 = (uv_fs_t *)0x15ac50;
      iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
      lVar4 = lVar4 + -1;
    } while (iVar1 != 0);
    if (lVar4 != 0) goto LAB_0015adc7;
    puStack_720 = (uv_fs_t *)0x15ac70;
    uv_fs_req_cleanup(&readdir_req);
    puStack_720 = (uv_fs_t *)0x15ac89;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_720 = (uv_fs_t *)0x15ac8e;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15ac9e;
    uv_fs_closedir(uVar2,&closedir_req,unaff_RBX,0);
    if (closedir_req.result != 0) goto LAB_0015adfe;
    puStack_720 = (uv_fs_t *)0x15acb8;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_720 = (uv_fs_t *)0x15acd1;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_720 = (uv_fs_t *)0x15acd6;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15acef;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_0015ae03;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015ae08;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015ae0d;
    puStack_720 = (uv_fs_t *)0x15ad16;
    uVar2 = uv_default_loop();
    puStack_720 = (uv_fs_t *)0x15ad20;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0015ae12;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015ae17;
    if (non_empty_closedir_cb_count == 1) {
      puStack_720 = (uv_fs_t *)0x15ad47;
      uVar2 = uv_default_loop();
      puStack_720 = (uv_fs_t *)0x15ad63;
      uv_fs_rmdir(uVar2,local_1e8,"test_subdir",0);
      puStack_720 = (uv_fs_t *)0x15ad6b;
      uv_fs_req_cleanup(local_1e8);
      puStack_720 = (uv_fs_t *)0x15ad70;
      cleanup_test_files();
      puStack_720 = (uv_fs_t *)0x15ad75;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_720 = (uv_fs_t *)0x15ad89;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_720 = (uv_fs_t *)0x15ad93;
      uv_run(unaff_RBX,0);
      puStack_720 = (uv_fs_t *)0x15ad98;
      uVar2 = uv_default_loop();
      puStack_720 = (uv_fs_t *)0x15ada0;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015ae21;
    }
  }
  else {
LAB_0015adcc:
    puStack_720 = (uv_fs_t *)0x15add1;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar3 = unaff_RBX;
LAB_0015add1:
    puStack_720 = (uv_fs_t *)0x15add6;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015add6:
    puStack_720 = (uv_fs_t *)0x15addb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015addb:
    puStack_720 = (uv_fs_t *)0x15ade0;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015ade0:
    puStack_720 = (uv_fs_t *)0x15ade5;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015ade5:
    puStack_720 = (uv_fs_t *)0x15adea;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015adea:
    puStack_720 = (uv_fs_t *)0x15adef;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015adef:
    puStack_720 = (uv_fs_t *)0x15adf4;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015adf4:
    unaff_RBX = puVar3;
    puStack_720 = (uv_fs_t *)0x15adf9;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015adf9:
    puStack_720 = (uv_fs_t *)0x15adfe;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015adfe:
    puStack_720 = (uv_fs_t *)0x15ae03;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015ae03:
    puStack_720 = (uv_fs_t *)0x15ae08;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015ae08:
    puStack_720 = (uv_fs_t *)0x15ae0d;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015ae0d:
    puStack_720 = (uv_fs_t *)0x15ae12;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015ae12:
    puStack_720 = (uv_fs_t *)0x15ae17;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015ae17:
    puStack_720 = (uv_fs_t *)0x15ae1c;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_720 = (uv_fs_t *)0x15ae21;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015ae21:
  puStack_720 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_720 = unaff_RBX;
  uv_fs_unlink(0,auStack_8d8,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_8d8);
  uv_fs_unlink(0,auStack_8d8,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_8d8);
  uv_fs_rmdir(0,auStack_8d8,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_8d8);
  uv_fs_rmdir(0,auStack_8d8,"test_dir",0);
  iVar1 = uv_fs_req_cleanup(auStack_8d8);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT(r == 0);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT(entries_count == 3);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 0);
  ASSERT(non_empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 1);
  ASSERT(non_empty_closedir_cb_count == 1);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY();
  return 0;
 }